

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O2

QMetaType __thiscall QMetaType::fromName(QMetaType *this,QByteArrayView typeName)

{
  int typeId;
  char *typeName_00;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
  *typeName_01;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
  *this_00;
  int iVar1;
  long in_FS_OFFSET;
  QMetaType local_50;
  QArrayDataPointer<char> local_48;
  QReadLocker local_28;
  long local_20;
  
  typeName_01 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
                 *)typeName.m_size;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (int)this;
  if (iVar1 == 0) {
    typeId = 0;
  }
  else {
    this_00 = typeName_01;
    typeId = qMetaTypeStaticType((char *)typeName_01,iVar1);
    if (typeId == 0) {
      local_28.q_val =
           (quintptr)
           QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::(anonymous_namespace)::Q_QGS_customTypeRegistry>_>
           ::operator()(this_00);
      QReadLocker::relock(&local_28);
      typeId = qMetaTypeCustomType_unlocked((char *)typeName_01,iVar1);
      if (typeId == 0) {
        local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QMetaObject::normalizedType((QByteArray *)&local_48,(char *)typeName_01);
        typeName_00 = local_48.ptr;
        if (local_48.ptr == (char *)0x0) {
          typeName_00 = &QByteArray::_empty;
        }
        iVar1 = (int)local_48.size;
        typeId = qMetaTypeStaticType(typeName_00,(int)local_48.size);
        if (typeId == 0) {
          typeId = qMetaTypeCustomType_unlocked(typeName_00,iVar1);
        }
        QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
      }
      QReadLocker::~QReadLocker(&local_28);
    }
  }
  QMetaType(&local_50,typeId);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QMetaType)local_50.d_ptr;
  }
  __stack_chk_fail();
}

Assistant:

QMetaType QMetaType::fromName(QByteArrayView typeName)
{
    return QMetaType(qMetaTypeTypeImpl<TryNormalizeType>(typeName.data(), typeName.size()));
}